

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image * rf_get_screen_data_ez(void)

{
  int iVar1;
  int iVar2;
  rf_color *dst;
  rf_image *in_RDI;
  ulong dst_size;
  
  iVar1 = (rf__ctx->field_0).render_width;
  if ((iVar1 < 0) || (iVar2 = (rf__ctx->field_0).render_height, iVar2 < 0)) {
    in_RDI->data = (void *)0x0;
    in_RDI->width = 0;
    in_RDI->height = 0;
    in_RDI->format = 0;
    in_RDI->valid = false;
    *(undefined3 *)&in_RDI->field_0x15 = 0;
  }
  else {
    dst_size = (ulong)(uint)(iVar2 * iVar1);
    dst = (rf_color *)malloc(dst_size * 4);
    rf_get_screen_data(in_RDI,dst,dst_size);
  }
  return in_RDI;
}

Assistant:

RF_API rf_image rf_get_screen_data_ez()
{
    if (rf_ctx.render_width < 0 || rf_ctx.render_height < 0) return (rf_image) {0};

    int size = rf_ctx.render_width * rf_ctx.render_height;
    rf_color* dst = RF_ALLOC(RF_DEFAULT_ALLOCATOR, size * sizeof(rf_color));
    rf_image result = rf_get_screen_data(dst, size);

    return result;
}